

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall
ON_Layer::UpdateReferencedComponents
          (ON_Layer *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  uint uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined2 uVar5;
  ON_UUID manifest_item_id_00;
  bool bVar6;
  bool bVar7;
  ON_UUID *pOVar8;
  ON_ComponentManifestItem *this_00;
  int destination_material_index;
  ON_UUID manifest_item_id;
  ON_UUID_struct local_58;
  ON_UUID local_48;
  ON_UUID local_38;
  undefined4 uVar4;
  
  if (this->m_material_index < 0) {
    bVar6 = true;
  }
  else {
    pOVar8 = &local_48;
    local_48.Data1 = 0x80000001;
    bVar6 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Material,this->m_material_index,destination_manifest,
                       (int *)pOVar8);
    if (!bVar6) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x6a,"","Unable to update render material reference.");
      pOVar8 = (ON_UUID *)&Default.m_material_index;
    }
    uVar1 = pOVar8->Data1;
    if (this->m_material_index != uVar1) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    }
    this->m_material_index = uVar1;
  }
  if (-1 < this->m_linetype_index) {
    pOVar8 = &local_48;
    local_48.Data1 = 0x80000001;
    bVar7 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,LinePattern,this->m_linetype_index,destination_manifest,
                       (int *)pOVar8);
    if (!bVar7) {
      bVar6 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x80,"","Unable to update line pattern reference.");
      pOVar8 = (ON_UUID *)&Default.m_linetype_index;
    }
    uVar1 = pOVar8->Data1;
    if (this->m_linetype_index != uVar1) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      this->m_linetype_index = uVar1;
    }
  }
  pOVar8 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
  uVar2 = pOVar8->Data1;
  uVar3 = pOVar8->Data2;
  uVar5 = pOVar8->Data3;
  uVar4 = CONCAT22(uVar5,uVar3);
  local_58.Data4._0_4_ = SUB84(*(undefined8 *)pOVar8->Data4,0);
  local_58.Data4._4_4_ = SUB84((ulong)*(undefined8 *)pOVar8->Data4 >> 0x20,0);
  local_58.Data1 = uVar2;
  local_58._4_4_ = uVar4;
  bVar7 = ::operator!=(&ON_nil_uuid,&local_58);
  if (bVar7) {
    manifest_item_id_00.Data2 = local_58.Data2;
    manifest_item_id_00.Data3 = local_58.Data3;
    manifest_item_id_00.Data1 = local_58.Data1;
    manifest_item_id_00.Data4[0] = local_58.Data4[0];
    manifest_item_id_00.Data4[1] = local_58.Data4[1];
    manifest_item_id_00.Data4[2] = local_58.Data4[2];
    manifest_item_id_00.Data4[3] = local_58.Data4[3];
    manifest_item_id_00.Data4[4] = local_58.Data4[4];
    manifest_item_id_00.Data4[5] = local_58.Data4[5];
    manifest_item_id_00.Data4[6] = local_58.Data4[6];
    manifest_item_id_00.Data4[7] = local_58.Data4[7];
    this_00 = ON_ComponentManifest::ItemFromId(destination_manifest,Layer,manifest_item_id_00);
    local_38 = ON_ComponentManifestItem::Id(this_00);
    bVar7 = ::operator==(&ON_nil_uuid,&local_38);
    if (bVar7) {
      bVar6 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x91,"","Unable to update parent layer id reference.");
      pOVar8 = ON_ModelComponent::ParentId(&Default.super_ON_ModelComponent);
      local_58.Data2 = pOVar8->Data2;
      local_58.Data3 = pOVar8->Data3;
      local_58.Data1 = pOVar8->Data1;
      local_58.Data4._0_4_ = *(undefined4 *)pOVar8->Data4;
      local_58.Data4._4_4_ = *(undefined4 *)(pOVar8->Data4 + 4);
    }
    else {
      local_58.Data1 = local_38.Data1;
      local_58._4_4_ = local_38._4_4_;
      local_58.Data4._0_4_ = local_38.Data4._0_4_;
      local_58.Data4._4_4_ = local_38.Data4._4_4_;
    }
    local_48.Data2 = local_58.Data2;
    local_48.Data3 = local_58.Data3;
    local_48.Data1 = local_58.Data1;
    local_48.Data4[4] = local_58.Data4[4];
    local_48.Data4[5] = local_58.Data4[5];
    local_48.Data4[6] = local_58.Data4[6];
    local_48.Data4[7] = local_58.Data4[7];
    local_48.Data4[0] = local_58.Data4[0];
    local_48.Data4[1] = local_58.Data4[1];
    local_48.Data4[2] = local_58.Data4[2];
    local_48.Data4[3] = local_58.Data4[3];
    ON_ModelComponent::SetParentId(&this->super_ON_ModelComponent,&local_48);
  }
  return bVar6;
}

Assistant:

bool ON_Layer::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update render material reference
  int material_index = RenderMaterialIndex();
  if (material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::RenderMaterial,
      material_index,
      destination_manifest,
      &destination_material_index))
    {
      material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      material_index = ON_Layer::Default.RenderMaterialIndex();
    }
    SetRenderMaterialIndex(material_index);
  }

  // Update line pattern reference
  int line_pattern_index = LinetypeIndex();
  if (line_pattern_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::LinePattern,
      line_pattern_index,
      destination_manifest,
      &destination_line_pattern_index))
    {
      line_pattern_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      line_pattern_index = ON_Layer::Default.LinetypeIndex();
    }
    SetLinetypeIndex(line_pattern_index);
  }

  // Update parent layer reference
  ON_UUID parent_layer_id = ParentLayerId();
  if (ON_nil_uuid != parent_layer_id)
  {
    const ON_UUID manifest_item_id = destination_manifest.ItemFromId(
      ON_ModelComponent::Type::Layer,
      parent_layer_id
      ).Id();
    if ( ON_nil_uuid == manifest_item_id )
    {
      ON_ERROR("Unable to update parent layer id reference.");
      rc = false;
      parent_layer_id = ON_Layer::Default.ParentLayerId();
    }
    else
    {
      parent_layer_id = manifest_item_id;
    }
    SetParentLayerId(parent_layer_id);
  }

  return rc;
}